

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O1

_Bool rtosc_match_args(char *pattern,char *msg)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  _Bool _Var4;
  
  do {
    if (*pattern != ':') {
      return true;
    }
    pattern = pattern + 1;
    pcVar3 = rtosc_argument_string(msg);
    _Var4 = true;
    if (*pattern == '\0') {
      _Var4 = *pcVar3 == '\0';
    }
    while( true ) {
      cVar1 = *pattern;
      if (cVar1 == '\0') {
        return _Var4;
      }
      if (cVar1 == ':') break;
      pattern = pattern + 1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      _Var4 = (_Bool)(_Var4 & cVar1 == cVar2);
    }
  } while ((_Var4 == false) || (*pcVar3 != '\0'));
  return true;
}

Assistant:

static bool rtosc_match_args(const char *pattern, const char *msg)
{
    //match anything if now arg restriction is present (ie the ':')
    if(*pattern++ != ':')
        return true;

    const char *arg_str = rtosc_argument_string(msg);
    bool      arg_match = *pattern || *pattern == *arg_str;

    while(*pattern && *pattern != ':')
        arg_match &= (*pattern++==*arg_str++);

    if(*pattern==':') {
        if(arg_match && !*arg_str)
            return true;
        else
            return rtosc_match_args(pattern, msg); //retry
    }

    return arg_match;
}